

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-alloc-cb-fail.c
# Opt level: O1

void cl_recv_cb(uv_udp_t *handle,ssize_t nread,uv_buf_t *buf,sockaddr *addr,uint flags)

{
  int iVar1;
  
  if (handle == &client || handle == &server) {
    if (flags != 0) goto LAB_00179845;
    if (nread < 0) goto LAB_0017984a;
    if (nread == 0) {
      if (addr == (sockaddr *)0x0) {
        return;
      }
      goto LAB_0017985e;
    }
    if (addr == (sockaddr *)0x0) goto LAB_0017984f;
    if (nread != 4) goto LAB_00179854;
    if (*(int *)buf->base == 0x474e4f50) {
      cl_recv_cb_called = cl_recv_cb_called + 1;
      uv_close((uv_handle_t *)handle,close_cb);
      return;
    }
  }
  else {
    cl_recv_cb_cold_1();
LAB_00179845:
    cl_recv_cb_cold_2();
LAB_0017984a:
    cl_recv_cb_cold_7();
LAB_0017984f:
    cl_recv_cb_cold_5();
LAB_00179854:
    cl_recv_cb_cold_3();
  }
  cl_recv_cb_cold_4();
LAB_0017985e:
  cl_recv_cb_cold_6();
  iVar1 = uv_is_closing((uv_handle_t *)handle);
  if (iVar1 != 0) {
    return;
  }
  uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
  return;
}

Assistant:

static void cl_recv_cb(uv_udp_t* handle,
                       ssize_t nread,
                       const uv_buf_t* buf,
                       const struct sockaddr* addr,
                       unsigned flags) {
  CHECK_HANDLE(handle);
  ASSERT(flags == 0);
  ASSERT(nread == UV_ENOBUFS);

  cl_recv_cb_called++;

  uv_close((uv_handle_t*) handle, close_cb);
}